

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O0

void BN_CTX_free(BN_CTX *c)

{
  BN_POOL *unaff_retaddr;
  
  if (c != (BN_CTX *)0x0) {
    BN_STACK_finish((BN_STACK *)0x112b9b);
    BN_POOL_finish(unaff_retaddr);
    CRYPTO_free(c);
  }
  return;
}

Assistant:

void BN_CTX_free(BN_CTX *ctx)
{
    if (ctx == NULL)
        return;
#ifdef BN_CTX_DEBUG
    {
        BN_POOL_ITEM *pool = ctx->pool.head;
        fprintf(stderr, "BN_CTX_free, stack-size=%d, pool-bignums=%d\n",
                ctx->stack.size, ctx->pool.size);
        fprintf(stderr, "dmaxs: ");
        while (pool) {
            unsigned loop = 0;
            while (loop < BN_CTX_POOL_SIZE)
                fprintf(stderr, "%02x ", pool->vals[loop++].dmax);
            pool = pool->next;
        }
        fprintf(stderr, "\n");
    }
#endif
    BN_STACK_finish(&ctx->stack);
    BN_POOL_finish(&ctx->pool);
    CRYPTO_free(ctx);
}